

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O1

void secp256k1_rfc6979_hmac_sha256_generate
               (secp256k1_rfc6979_hmac_sha256_t *rng,uchar *out,size_t outlen)

{
  uchar *key;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  size_t keylen;
  size_t extraout_RDX;
  secp256k1_hmac_sha256_t hmac;
  secp256k1_hmac_sha256_t local_f0;
  
  if (rng->retry != 0) {
    key = rng->k;
    secp256k1_hmac_sha256_initialize(&local_f0,key,outlen);
    secp256k1_sha256_write(&local_f0.inner,rng->v,0x20);
    secp256k1_sha256_write(&local_f0.inner,"",1);
    secp256k1_hmac_sha256_finalize(&local_f0,key);
    secp256k1_hmac_sha256_initialize(&local_f0,key,keylen);
    secp256k1_sha256_write(&local_f0.inner,rng->v,0x20);
    secp256k1_hmac_sha256_finalize(&local_f0,rng->v);
    outlen = extraout_RDX;
  }
  secp256k1_hmac_sha256_initialize(&local_f0,rng->k,outlen);
  secp256k1_sha256_write(&local_f0.inner,rng->v,0x20);
  secp256k1_hmac_sha256_finalize(&local_f0,rng->v);
  uVar1 = *(undefined8 *)rng->v;
  uVar2 = *(undefined8 *)(rng->v + 8);
  uVar3 = *(undefined8 *)(rng->v + 0x18);
  *(undefined8 *)(out + 0x10) = *(undefined8 *)(rng->v + 0x10);
  *(undefined8 *)(out + 0x18) = uVar3;
  *(undefined8 *)out = uVar1;
  *(undefined8 *)(out + 8) = uVar2;
  rng->retry = 1;
  return;
}

Assistant:

static void secp256k1_rfc6979_hmac_sha256_generate(secp256k1_rfc6979_hmac_sha256_t *rng, unsigned char *out, size_t outlen) {
    /* RFC6979 3.2.h. */
    static const unsigned char zero[1] = {0x00};
    if (rng->retry) {
        secp256k1_hmac_sha256_t hmac;
        secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
        secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
        secp256k1_hmac_sha256_write(&hmac, zero, 1);
        secp256k1_hmac_sha256_finalize(&hmac, rng->k);
        secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
        secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
        secp256k1_hmac_sha256_finalize(&hmac, rng->v);
    }

    while (outlen > 0) {
        secp256k1_hmac_sha256_t hmac;
        int now = outlen;
        secp256k1_hmac_sha256_initialize(&hmac, rng->k, 32);
        secp256k1_hmac_sha256_write(&hmac, rng->v, 32);
        secp256k1_hmac_sha256_finalize(&hmac, rng->v);
        if (now > 32) {
            now = 32;
        }
        memcpy(out, rng->v, now);
        out += now;
        outlen -= now;
    }

    rng->retry = 1;
}